

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool hasLSTMWeightParamOfType(LSTMWeightParams *params,WeightParamType *type)

{
  bool bVar1;
  WeightParams *pWVar2;
  
  pWVar2 = params->inputgateweightmatrix_;
  if (pWVar2 == (WeightParams *)0x0) {
    pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
  }
  bVar1 = isWeightParamOfType(pWVar2,type);
  if (!bVar1) {
    pWVar2 = params->forgetgateweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    }
    bVar1 = isWeightParamOfType(pWVar2,type);
    if (!bVar1) {
      pWVar2 = params->blockinputweightmatrix_;
      if (pWVar2 == (WeightParams *)0x0) {
        pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar1 = isWeightParamOfType(pWVar2,type);
      if (!bVar1) {
        pWVar2 = params->outputgateweightmatrix_;
        if (pWVar2 == (WeightParams *)0x0) {
          pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar1 = isWeightParamOfType(pWVar2,type);
        if (!bVar1) {
          pWVar2 = params->inputgaterecursionmatrix_;
          if (pWVar2 == (WeightParams *)0x0) {
            pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
          }
          bVar1 = isWeightParamOfType(pWVar2,type);
          if (!bVar1) {
            pWVar2 = params->forgetgaterecursionmatrix_;
            if (pWVar2 == (WeightParams *)0x0) {
              pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
            }
            bVar1 = isWeightParamOfType(pWVar2,type);
            if (!bVar1) {
              pWVar2 = params->blockinputrecursionmatrix_;
              if (pWVar2 == (WeightParams *)0x0) {
                pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
              }
              bVar1 = isWeightParamOfType(pWVar2,type);
              if (!bVar1) {
                pWVar2 = params->outputgaterecursionmatrix_;
                if (pWVar2 == (WeightParams *)0x0) {
                  pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
                }
                bVar1 = isWeightParamOfType(pWVar2,type);
                if (!bVar1) {
                  pWVar2 = params->inputgatebiasvector_;
                  if (pWVar2 == (WeightParams *)0x0) {
                    pWVar2 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_
                    ;
                  }
                  bVar1 = isWeightParamOfType(pWVar2,type);
                  if (!bVar1) {
                    pWVar2 = params->forgetgatebiasvector_;
                    if (pWVar2 == (WeightParams *)0x0) {
                      pWVar2 = (WeightParams *)
                               &CoreML::Specification::_WeightParams_default_instance_;
                    }
                    bVar1 = isWeightParamOfType(pWVar2,type);
                    if (!bVar1) {
                      pWVar2 = params->blockinputbiasvector_;
                      if (pWVar2 == (WeightParams *)0x0) {
                        pWVar2 = (WeightParams *)
                                 &CoreML::Specification::_WeightParams_default_instance_;
                      }
                      bVar1 = isWeightParamOfType(pWVar2,type);
                      if (!bVar1) {
                        pWVar2 = params->outputgatebiasvector_;
                        if (pWVar2 == (WeightParams *)0x0) {
                          pWVar2 = (WeightParams *)
                                   &CoreML::Specification::_WeightParams_default_instance_;
                        }
                        bVar1 = isWeightParamOfType(pWVar2,type);
                        if (!bVar1) {
                          pWVar2 = params->inputgatepeepholevector_;
                          if (pWVar2 == (WeightParams *)0x0) {
                            pWVar2 = (WeightParams *)
                                     &CoreML::Specification::_WeightParams_default_instance_;
                          }
                          bVar1 = isWeightParamOfType(pWVar2,type);
                          if (!bVar1) {
                            pWVar2 = params->forgetgatepeepholevector_;
                            if (pWVar2 == (WeightParams *)0x0) {
                              pWVar2 = (WeightParams *)
                                       &CoreML::Specification::_WeightParams_default_instance_;
                            }
                            bVar1 = isWeightParamOfType(pWVar2,type);
                            if (!bVar1) {
                              pWVar2 = params->outputgatepeepholevector_;
                              if (pWVar2 == (WeightParams *)0x0) {
                                pWVar2 = (WeightParams *)
                                         &CoreML::Specification::_WeightParams_default_instance_;
                              }
                              bVar1 = isWeightParamOfType(pWVar2,type);
                              return bVar1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static bool hasLSTMWeightParamOfType(const Specification::LSTMWeightParams& params,
                                               const WeightParamType& type) {

    return (isWeightParamOfType(params.inputgateweightmatrix(), type) ||
            isWeightParamOfType(params.forgetgateweightmatrix(), type) ||
            isWeightParamOfType(params.blockinputweightmatrix(), type) ||
            isWeightParamOfType(params.outputgateweightmatrix(), type) ||

            isWeightParamOfType(params.inputgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.forgetgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.blockinputrecursionmatrix(), type) ||
            isWeightParamOfType(params.outputgaterecursionmatrix(), type) ||

            isWeightParamOfType(params.inputgatebiasvector(), type) ||
            isWeightParamOfType(params.forgetgatebiasvector(), type) ||
            isWeightParamOfType(params.blockinputbiasvector(), type) ||
            isWeightParamOfType(params.outputgatebiasvector(), type) ||

            isWeightParamOfType(params.inputgatepeepholevector(), type) ||
            isWeightParamOfType(params.forgetgatepeepholevector(), type) ||
            isWeightParamOfType(params.outputgatepeepholevector(), type));
}